

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddLeft(CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int *piVar1;
  int iVar2;
  TVariableType type_00;
  _WordT _Var3;
  undefined4 uVar4;
  CQualifier *pCVar5;
  bool bVar6;
  TVariableType TVar7;
  long lVar8;
  CQualifier *this_00;
  CQualifier *defaultQualifier;
  CQualifier *local_38;
  
  local_38 = (CQualifier *)0x0;
  TVar7 = checkTypeTag(this,type,&local_38);
  if (TVar7 != VT_None) {
    bVar6 = checkName(this,name);
    if (bVar6) {
      iVar2 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4);
      lVar8 = (long)iVar2;
      if (lVar8 == -1) {
        iVar2 = this->firstFreeVariableIndex;
        *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4) = iVar2;
        this->firstFreeVariableIndex = iVar2 + 1;
        this_00 = &this->variables[iVar2].Qualifier;
        this->variables[iVar2].Type = TVar7;
        this->variables[iVar2].CountLeft = 1;
        this->variables[iVar2].CountRight = 0;
        bVar6 = CQualifier::IsEmpty(this_00);
        pCVar5 = local_38;
        if (!bVar6) {
          __assert_fail("variable.Qualifier.IsEmpty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                        ,0x83,
                        "TVariableIndex Refal2::CVariablesBuilder::AddLeft(const TVariableName, const TVariableTypeTag)"
                       );
        }
        if (local_38 == (CQualifier *)0x0) {
          return iVar2;
        }
        this->variables[iVar2].Qualifier.ansichars.super__Base_bitset<2UL>._M_w[1] =
             (local_38->ansichars).super__Base_bitset<2UL>._M_w[1];
        uVar4 = *(undefined4 *)&local_38->field_0x4;
        _Var3 = (local_38->ansichars).super__Base_bitset<2UL>._M_w[0];
        this_00->flags = local_38->flags;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        this->variables[iVar2].Qualifier.ansichars.super__Base_bitset<2UL>._M_w[0] = _Var3;
        CFastSet<char>::operator=(&this->variables[iVar2].Qualifier.chars,&local_38->chars);
        CFastSet<int>::operator=(&this->variables[iVar2].Qualifier.labels,&pCVar5->labels);
        CFastSet<unsigned_int>::operator=
                  (&this->variables[iVar2].Qualifier.numbers,&pCVar5->numbers);
        return iVar2;
      }
      type_00 = this->variables[lVar8].Type;
      if (type_00 == TVar7) {
        piVar1 = &this->variables[lVar8].CountRight;
        *piVar1 = *piVar1 + 1;
        return iVar2;
      }
      errorTypesNotMatched(this,name,type_00);
    }
  }
  return -1;
}

Assistant:

TVariableIndex CVariablesBuilder::AddLeft( const TVariableName name,
	const TVariableTypeTag type )
{
	const CQualifier* defaultQualifier = nullptr;
	const TVariableType variableType = checkTypeTag( type, &defaultQualifier );
	if( variableType != VT_None && checkName( name ) ) {
		if( variableNameToIndex[name] == InvalidVariableIndex ) {
			variableNameToIndex[name] = firstFreeVariableIndex;
			firstFreeVariableIndex++;
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			variable.Type = variableType;
			variable.CountLeft = 1;
			variable.CountRight = 0;
			assert( variable.Qualifier.IsEmpty() );
			if( defaultQualifier != nullptr ) {
				variable.Qualifier = *defaultQualifier;
			}
			return variableIndex;
		} else {
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		}
	}
	return InvalidVariableIndex;
}